

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

void __thiscall
icu_63::AnnualTimeZoneRule::AnnualTimeZoneRule(AnnualTimeZoneRule *this,AnnualTimeZoneRule *source)

{
  DateTimeRule *this_00;
  AnnualTimeZoneRule *size;
  DateTimeRule *local_38;
  AnnualTimeZoneRule *source_local;
  AnnualTimeZoneRule *this_local;
  
  size = source;
  TimeZoneRule::TimeZoneRule(&this->super_TimeZoneRule,&source->super_TimeZoneRule);
  (this->super_TimeZoneRule).super_UObject._vptr_UObject =
       (_func_int **)&PTR__AnnualTimeZoneRule_004aa390;
  this_00 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
  local_38 = (DateTimeRule *)0x0;
  if (this_00 != (DateTimeRule *)0x0) {
    DateTimeRule::DateTimeRule(this_00,source->fDateTimeRule);
    local_38 = this_00;
  }
  this->fDateTimeRule = local_38;
  this->fStartYear = source->fStartYear;
  this->fEndYear = source->fEndYear;
  return;
}

Assistant:

AnnualTimeZoneRule::AnnualTimeZoneRule(const AnnualTimeZoneRule& source)
: TimeZoneRule(source), fDateTimeRule(new DateTimeRule(*(source.fDateTimeRule))),
  fStartYear(source.fStartYear), fEndYear(source.fEndYear) {
}